

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::executeTestCase(SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  int iVar2;
  deUint32 dVar3;
  _out_ch_desc *p_Var4;
  size_t format_idx;
  undefined4 extraout_var;
  GLint out_channel_size;
  GLint param [4];
  GLint local_54;
  size_t local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar5;
  
  sVar1 = test_case->m_source_texture_format_index;
  local_48._0_4_ = test_case->m_texture_swizzle_red;
  local_48._4_4_ = test_case->m_texture_swizzle_green;
  uStack_40._0_4_ = test_case->m_texture_swizzle_blue;
  uStack_40._4_4_ = test_case->m_texture_swizzle_alpha;
  local_50 = get_swizzled_channel_idx(test_case->m_channel_index,(GLint *)&local_48);
  local_54 = 0;
  p_Var4 = get_descriptor_for_channel((_texture_format *)(&texture_formats + sVar1 * 0x1e),local_50)
  ;
  format_idx = get_index_of_format(p_Var4->m_internal_format);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  prepareOutputTexture(this,format_idx);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_out_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa7a);
  (**(code **)(lVar5 + 0x78))(0x8d40,this->m_test_fbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa7d);
  (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_out_tex_id,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"FramebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa80);
  (**(code **)(lVar5 + 0x1a00))(0,0,8,8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa84);
  (**(code **)(lVar5 + 0xab0))(0xde1,0,0x805c,&local_54);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetTexLevelParameteriv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa88);
  (**(code **)(lVar5 + 0xb8))(0xde1,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa8c);
  sVar1 = local_50;
  prepareAndTestProgram(this,test_case,format_idx,local_54,local_50,true);
  prepareAndTestProgram(this,test_case,format_idx,local_54,sVar1,false);
  (**(code **)(lVar5 + 0x78))(0x8d40,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa93);
  return;
}

Assistant:

void SmokeTest::executeTestCase(const testCase& test_case)
{
	const _texture_format& source_format	   = texture_formats[test_case.m_source_texture_format_index];
	const glw::GLint	   red				   = test_case.m_texture_swizzle_red;
	const glw::GLint	   green			   = test_case.m_texture_swizzle_green;
	const glw::GLint	   blue				   = test_case.m_texture_swizzle_blue;
	const glw::GLint	   alpha			   = test_case.m_texture_swizzle_alpha;
	const glw::GLint	   param[4]			   = { red, green, blue, alpha };
	const size_t		   channel			   = get_swizzled_channel_idx(test_case.m_channel_index, param);
	glw::GLint			   out_channel_size	= 0;
	const glw::GLenum	  out_internal_format = get_internal_format_for_channel(source_format, channel);
	const size_t		   out_format_idx	  = get_index_of_format(out_internal_format);

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare output */
	prepareOutputTexture(out_format_idx);

	gl.bindTexture(GL_TEXTURE_2D, m_out_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_test_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_out_tex_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

	/* Set Viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_output_width, m_output_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	/* Get internal storage size of output texture */
	gl.getTexLevelParameteriv(GL_TEXTURE_2D, 0 /* level */, GL_TEXTURE_RED_SIZE, &out_channel_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

	/* Unbind output texture */
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	prepareAndTestProgram(test_case, out_format_idx, out_channel_size, channel, true);
	prepareAndTestProgram(test_case, out_format_idx, out_channel_size, channel, false);

	/* Unbind FBO */
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");
}